

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O3

void CheckStackTrace2(int i)

{
  int j;
  bool bVar1;
  void *unaff_retaddr;
  
  if (expected_range[4].start < unaff_retaddr) {
    if (expected_range[4].end < unaff_retaddr) {
      printf("Adjusting range from %p..%p to %p..%p\n",expected_range[4].start,expected_range[4].end
             ,expected_range[4].start,unaff_retaddr);
      expected_range[4].end = unaff_retaddr;
    }
    expected_range[3].start = (void *)0x101f53;
    expected_range[3].end = (void *)0x101f63;
    if (-1 < i) {
      do {
        CheckStackTrace3(i);
        bVar1 = i != 0;
        i = i + -1;
      } while (bVar1);
    }
    return;
  }
  fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stacktrace_unittest.cc"
          ,0x14c,"(&expected_range[4])->start","<","ra");
  abort();
}

Assistant:

void ATTRIBUTE_NOINLINE CheckStackTrace2(int i) {
  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[4]);
  INIT_ADDRESS_RANGE(CheckStackTrace2, start, end, &expected_range[3]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--)
    CheckStackTrace3(j);
  DECLARE_ADDRESS_LABEL(end);
}